

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpIntLeft::TypeOpIntLeft(TypeOpIntLeft *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"<<",&local_31);
  TypeOpBinary::TypeOpBinary(&this->super_TypeOpBinary,t,CPUI_INT_LEFT,&local_30,TYPE_INT,TYPE_INT);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f30f0;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x10000;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 3;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_LEFT;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe778;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntLeft::TypeOpIntLeft(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_LEFT,"<<",TYPE_INT,TYPE_INT)
{
  opflags = PcodeOp::binary;
  addlflags = inherits_sign | inherits_sign_zero;
  behave = new OpBehaviorIntLeft();
}